

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_struct_as_root(void *buf,size_t bufsiz,char *fid,size_t size,uint16_t align)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = flatcc_verify_buffer_header(buf,bufsiz,fid);
  if (iVar2 == 0) {
    uVar1 = *buf;
    iVar2 = 0x12;
    if (uVar1 - 1 < (uint)bufsiz) {
      iVar2 = 10;
      if ((!CARRY4((uint)size,uVar1)) && (iVar2 = 9, (uint)size + uVar1 <= (uint)bufsiz)) {
        iVar2 = 0xb;
        if ((uVar1 & align - 1) == 0) {
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_struct_as_root(const void *buf, size_t bufsiz, const char *fid, size_t size, uint16_t align)
{
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_struct((uoffset_t)bufsiz, 0, read_uoffset(buf, 0), (uoffset_t)size, align);
}